

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

DdNode * Extra_zddUnateInfoCompute(DdManager *dd,DdNode *bF,DdNode *bVars)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *bVars_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraZddUnateInfoCompute(dd,bF,bVars);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_zddUnateInfoCompute( 
  DdManager * dd,   /* the DD manager */
  DdNode * bF,
  DdNode * bVars) 
{
    DdNode * res;
    do {
        dd->reordered = 0;
        res = extraZddUnateInfoCompute( dd, bF, bVars );
    } while (dd->reordered == 1);
    return(res);

}